

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void mark_as_moved(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn,
                  bitmap_t loop_invariant_bb_insn_bitmap,bitmap_t bb_insns_to_move_bitmap)

{
  void *pvVar1;
  int iVar2;
  size_t sVar3;
  bb_insn_t_conflict pbVar4;
  int op_num;
  MIR_reg_t var;
  insn_var_iterator_t iter;
  int local_64;
  bitmap_t local_60;
  MIR_reg_t local_54;
  insn_var_iterator_t local_50;
  
  local_60 = bb_insns_to_move_bitmap;
  VARR_bb_insn_ttrunc(gen_ctx->temp_bb_insns2,0);
  VARR_bb_insn_tpush(gen_ctx->temp_bb_insns2,bb_insn);
  iVar2 = bitmap_bit_p(loop_invariant_bb_insn_bitmap,(ulong)bb_insn->index);
  if (iVar2 != 0) {
    while( true ) {
      sVar3 = VARR_bb_insn_tlength(gen_ctx->temp_bb_insns2);
      if (sVar3 == 0) break;
      pbVar4 = VARR_bb_insn_tpop(gen_ctx->temp_bb_insns2);
      bitmap_set_bit_p(local_60,(ulong)pbVar4->index);
      local_50.insn = pbVar4->insn;
      local_50.nops = (size_t)*(uint *)&(local_50.insn)->field_0x1c;
      local_50.op_num = 0;
      local_50.op_part_num = 0;
      while( true ) {
        iVar2 = input_insn_var_iterator_next(gen_ctx,&local_50,&local_54,&local_64);
        if (iVar2 == 0) break;
        pvVar1 = pbVar4->insn->ops[local_64].data;
        if (pvVar1 != (void *)0x0) {
          iVar2 = bitmap_bit_p(loop_invariant_bb_insn_bitmap,(ulong)pbVar4->index);
          if (iVar2 != 0) {
            VARR_bb_insn_tpush(gen_ctx->temp_bb_insns2,*(bb_insn_t_conflict *)((long)pvVar1 + 8));
          }
        }
      }
    }
    return;
  }
  __assert_fail("bitmap_bit_p (loop_invariant_bb_insn_bitmap, bb_insn->index)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x14e9,"void mark_as_moved(gen_ctx_t, bb_insn_t, bitmap_t, bitmap_t)");
}

Assistant:

static void mark_as_moved (gen_ctx_t gen_ctx, bb_insn_t bb_insn,
                           bitmap_t loop_invariant_bb_insn_bitmap,
                           bitmap_t bb_insns_to_move_bitmap) {
  int op_num;
  MIR_reg_t var;
  insn_var_iterator_t iter;
  ssa_edge_t se;

  VARR_TRUNC (bb_insn_t, temp_bb_insns2, 0);
  VARR_PUSH (bb_insn_t, temp_bb_insns2, bb_insn);
  gen_assert (bitmap_bit_p (loop_invariant_bb_insn_bitmap, bb_insn->index));
  while (VARR_LENGTH (bb_insn_t, temp_bb_insns2) != 0) {
    bb_insn = VARR_POP (bb_insn_t, temp_bb_insns2);
    bitmap_set_bit_p (bb_insns_to_move_bitmap, bb_insn->index);
    FOREACH_IN_INSN_VAR (gen_ctx, iter, bb_insn->insn, var, op_num)
    if ((se = bb_insn->insn->ops[op_num].data) != NULL
        && bitmap_bit_p (loop_invariant_bb_insn_bitmap, bb_insn->index))
      VARR_PUSH (bb_insn_t, temp_bb_insns2, se->def);
  }
}